

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  uint dig;
  size_t *psVar4;
  long in_RDX;
  utf8_ptr *in_RDI;
  wchar_t ch_1;
  int exp_neg;
  int acc;
  wchar_t ch;
  size_t idx;
  int pt;
  int significant;
  int neg;
  int exp;
  size_t rem;
  utf8_ptr p;
  size_t prec;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  utf8_ptr *in_stack_ffffffffffffff90;
  size_t *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  size_t *local_48;
  int local_38;
  
  psVar4 = (size_t *)get_prec((char *)0x2bf0ed);
  set_type((char *)in_RDI,0);
  memset((char *)((long)&in_RDI->p_ + 5),0,(long)psVar4 + 1U >> 1);
  utf8_ptr::utf8_ptr(in_stack_ffffffffffffff90,
                     (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  local_38 = 0;
  while( true ) {
    uVar7 = false;
    if (in_RDX != 0) {
      utf8_ptr::getch((utf8_ptr *)0x2bf15b);
      iVar2 = is_space(L'\0');
      uVar7 = iVar2 != 0;
    }
    if ((bool)uVar7 == false) break;
    utf8_ptr::inc((utf8_ptr *)
                  CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                  in_stack_ffffffffffffff98);
  }
  if ((in_RDX == 0) || (wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf19b), wVar3 != L'+')) {
    if ((in_RDX != 0) && (wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf1c3), wVar3 == L'-')) {
      local_38 = 1;
      utf8_ptr::inc((utf8_ptr *)
                    CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                    in_stack_ffffffffffffff98);
    }
  }
  else {
    utf8_ptr::inc((utf8_ptr *)
                  CONCAT17(uVar7,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                  in_stack_ffffffffffffff98);
  }
  set_neg((char *)in_RDI,local_38);
  while( true ) {
    bVar5 = false;
    if (in_RDX != 0) {
      utf8_ptr::getch((utf8_ptr *)0x2bf207);
      iVar2 = is_space(L'\0');
      bVar5 = iVar2 != 0;
    }
    if (bVar5 == false) break;
    utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(bVar5,in_stack_ffffffffffffffa0)),
                  in_stack_ffffffffffffff98);
  }
  bVar5 = false;
  bVar1 = false;
  local_48 = (size_t *)0x0;
  uVar6 = 0;
  while (in_RDX != 0) {
    wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf264);
    iVar2 = is_digit(L'\0');
    if (iVar2 == 0) {
      if ((wVar3 != L'.') || (bVar1)) {
        if ((wVar3 == L'e') || (wVar3 == L'E')) {
          utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)),
                        in_stack_ffffffffffffff98);
          if ((in_RDX == 0) || (wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf35b), wVar3 != L'+')) {
            if ((in_RDX != 0) && (wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf383), wVar3 == L'-')) {
              utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)),
                            in_stack_ffffffffffffff98);
            }
          }
          else {
            utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)),
                          in_stack_ffffffffffffff98);
          }
          goto LAB_002bf3a9;
        }
        break;
      }
      bVar1 = true;
    }
    else {
      if (wVar3 != L'0') {
        bVar5 = true;
      }
      if ((bVar5) && (local_48 < psVar4)) {
        in_stack_ffffffffffffff90 = in_RDI;
        in_stack_ffffffffffffff98 = local_48;
        dig = value_of_digit(wVar3);
        set_dig((char *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff98,dig);
        local_48 = (size_t *)((long)local_48 + 1);
      }
    }
    utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)),
                  in_stack_ffffffffffffff98);
  }
LAB_002bf437:
  set_exp((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  normalize((char *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)));
  return;
LAB_002bf3a9:
  if (in_RDX == 0) goto LAB_002bf437;
  wVar3 = utf8_ptr::getch((utf8_ptr *)0x2bf3bb);
  iVar2 = is_digit(L'\0');
  if (iVar2 == 0) goto LAB_002bf437;
  value_of_digit(wVar3);
  utf8_ptr::inc((utf8_ptr *)CONCAT17(uVar7,CONCAT16(uVar6,in_stack_ffffffffffffffa0)),
                in_stack_ffffffffffffff98);
  goto LAB_002bf3a9;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len)
{
    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the type to number */
    set_type(ext, VMBN_T_NUM);

    /* initially zero the mantissa */
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* initialize the exponent to zero */
    int exp = 0;

    /* presume it will be positive */
    int neg = FALSE;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* set the sign */
    set_neg(ext, neg);

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* we haven't yet found a significant digit */
    int significant = FALSE;

    /* shift the digits into the value */
    int pt = FALSE;
    for (size_t idx = 0 ; rem != 0 ; p.inc(&rem))
    {
        wchar_t ch;

        /* get this character */
        ch = p.getch();

        /* check for a digit */
        if (is_digit(ch))
        {
            /* 
             *   if it's not a zero, we're definitely into the significant
             *   part of the number 
             */
            if (ch != '0')
                significant = TRUE;

            /* 
             *   if it's significant, add it to the number - skip leading
             *   zeros, since they add no information to the number 
             */
            if (significant)
            {
                /* if we're not out of precision, add the digit */
                if (idx < prec)
                {
                    /* set the next digit */
                    set_dig(ext, idx, value_of_digit(ch));

                    /* move on to the next digit position */
                    ++idx;
                }

                /* 
                 *   that's another factor of 10 if we haven't found the
                 *   decimal point (whether or not we're out of precision to
                 *   actually store the digit, count the increase in the
                 *   exponent) 
                 */
                if (!pt)
                    ++exp;
            }
            else if (pt)
            {
                /* 
                 *   we haven't yet found a significant digit, so this is a
                 *   leading zero, but we have found the decimal point - this
                 *   reduces the exponent by one 
                 */
                --exp;
            }
        }
        else if (ch == '.' && !pt)
        {
            /* 
             *   this is the decimal point - note it; from now on, we won't
             *   increase the exponent as we add digits 
             */
            pt = TRUE;
        }
        else if (ch == 'e' || ch == 'E')
        {
            int acc;
            int exp_neg = FALSE;

            /* exponent - skip the 'e' */
            p.inc(&rem);

            /* check for a sign */
            if (rem != 0 && p.getch() == '+')
            {
                /* skip the sign */
                p.inc(&rem);
            }
            else if (rem != 0 && p.getch() == '-')
            {
                /* skip it and note it */
                p.inc(&rem);
                exp_neg = TRUE;
            }

            /* parse the exponent */
            for (acc = 0 ; rem != 0 ; p.inc(&rem))
            {
                wchar_t ch;

                /* if this is a digit, add it to the exponent */
                ch = p.getch();
                if (is_digit(ch))
                {
                    /* accumulate the digit */
                    acc *= 10;
                    acc += value_of_digit(ch);
                }
                else
                {
                    /* that's it for the exponent */
                    break;
                }
            }

            /* if it's negative, apply the sign */
            if (exp_neg)
                acc = -acc;

            /* add the exponent to the one we've calculated */
            exp += acc;

            /* after the exponent, we're done with the whole number */
            break;
        }
        else
        {
            /* it looks like we've reached the end of the number */
            break;
        }
    }

    /* set the exponent */
    set_exp(ext, exp);

    /* normalize the number */
    normalize(ext);
}